

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

bool __thiscall xatlas::internal::UniformGrid2::createGrid(UniformGrid2 *this)

{
  Array<unsigned_int> *this_00;
  Array<unsigned_int> *this_01;
  uint8_t *puVar1;
  Vector2 VVar2;
  uint32_t *puVar3;
  uint8_t *puVar4;
  bool bVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint32_t uVar11;
  uint32_t newBufferSize;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  uint32_t edge;
  uint8_t local_70 [4];
  uint local_6c;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar8 = (this->m_edges).m_base.size;
  uVar7 = (ulong)uVar8;
  if (uVar7 == 0) {
    fVar17 = -3.4028235e+38;
    local_68._4_4_ = -3.4028235e+38;
    fStack_5c = 0.0;
    fVar13 = 3.4028235e+38;
    fVar14 = 3.4028235e+38;
    fVar15 = 0.0;
  }
  else {
    puVar3 = this->m_indices;
    fVar13 = 3.4028235e+38;
    fVar17 = -3.4028235e+38;
    uVar9 = 0;
    fVar14 = 3.4028235e+38;
    local_68._4_4_ = -3.4028235e+38;
    do {
      fStack_5c = local_68._4_4_;
      fVar15 = fVar14;
      uVar12 = *(uint *)((this->m_edges).m_base.buffer + uVar9 * 4);
      uVar6 = uVar12;
      if (puVar3 != (uint32_t *)0x0) {
        uVar6 = puVar3[uVar12];
      }
      iVar10 = uVar12 % 3 + 1;
      if (iVar10 == 3) {
        iVar10 = 0;
      }
      uVar11 = iVar10 + (uVar12 / 3) * 3;
      if (puVar3 != (uint32_t *)0x0) {
        uVar11 = puVar3[uVar11];
      }
      VVar2 = this->m_positions[uVar6];
      fVar14 = VVar2.x;
      if (fVar14 <= fVar13) {
        fVar13 = fVar14;
      }
      if (fVar17 <= fVar14) {
        fVar17 = fVar14;
      }
      fVar16 = VVar2.y;
      fVar14 = fVar15;
      if (fVar16 <= fVar15) {
        fVar14 = fVar16;
      }
      local_68._4_4_ = fStack_5c;
      if (fStack_5c <= fVar16) {
        local_68._4_4_ = fVar16;
      }
      VVar2 = this->m_positions[uVar11];
      fVar16 = VVar2.x;
      if (fVar16 <= fVar13) {
        fVar13 = fVar16;
      }
      if (fVar17 <= fVar16) {
        fVar17 = fVar16;
      }
      fVar16 = VVar2.y;
      if (fVar16 <= fVar14) {
        fVar14 = fVar16;
      }
      if (local_68._4_4_ <= fVar16) {
        local_68._4_4_ = fVar16;
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  VVar2.y = fVar14;
  VVar2.x = fVar13;
  this->m_gridOrigin = VVar2;
  fVar17 = fVar17 - fVar13;
  local_68._4_4_ = local_68._4_4_ - fVar14;
  fStack_60 = fStack_5c - fVar15;
  fStack_5c = fStack_5c - fVar15;
  fVar13 = (float)uVar7;
  local_68._0_4_ = fVar17;
  if (local_68._4_4_ <= fVar17) {
    local_68._0_4_ = local_68._4_4_;
  }
  local_58 = CONCAT44(local_68._4_4_,local_68._4_4_);
  fStack_50 = local_68._4_4_;
  fStack_4c = local_68._4_4_;
  if (fVar13 < 0.0) {
    local_48 = fVar17;
    fStack_44 = local_68._4_4_;
    fStack_40 = fStack_60;
    fStack_3c = fStack_5c;
    fVar13 = sqrtf(fVar13);
    fVar17 = local_48;
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  local_68._0_4_ = (float)local_68 / fVar13;
  this->m_cellSize = (float)local_68;
  if ((float)local_68 <= 0.0) {
    bVar5 = false;
  }
  else {
    fVar13 = ceilf(fVar17 / (float)local_68);
    uVar11 = (uint32_t)(long)fVar13;
    this->m_gridWidth = uVar11;
    fVar13 = ceilf((float)local_58 / (float)local_68);
    uVar6 = (uint32_t)(long)fVar13;
    this->m_gridHeight = uVar6;
    bVar5 = false;
    if ((uVar11 != 0) && (bVar5 = false, uVar6 != 0)) {
      this_00 = &this->m_cellDataOffsets;
      uVar12 = uVar11 * uVar6;
      (this->m_cellDataOffsets).m_base.size = uVar12;
      if ((this->m_cellDataOffsets).m_base.capacity < uVar12) {
        ArrayBase::setArrayCapacity(&this_00->m_base,uVar12);
      }
      if ((this->m_cellDataOffsets).m_base.size != 0) {
        puVar4 = (this_00->m_base).buffer;
        uVar9 = 0;
        do {
          puVar1 = puVar4 + uVar9 * 4;
          puVar1[0] = 0xff;
          puVar1[1] = 0xff;
          puVar1[2] = 0xff;
          puVar1[3] = 0xff;
          uVar9 = uVar9 + 1;
        } while (uVar9 < (this->m_cellDataOffsets).m_base.size);
      }
      this_01 = &this->m_cellData;
      (this->m_cellData).m_base.size = 0;
      uVar8 = uVar8 * 2;
      if ((this->m_cellData).m_base.capacity < uVar8) {
        ArrayBase::setArrayCapacity(&this_01->m_base,uVar8);
      }
      bVar5 = true;
      if (uVar7 != 0) {
        uVar9 = 0;
        local_58 = uVar7;
        do {
          if ((this->m_edges).m_base.size <= uVar9) {
LAB_001b43de:
            __assert_fail("index < m_base.size",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0x4ae,
                          "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]"
                         );
          }
          local_6c = *(uint *)((this->m_edges).m_base.buffer + uVar9 * 4);
          puVar3 = this->m_indices;
          uVar8 = local_6c;
          if (puVar3 != (uint32_t *)0x0) {
            uVar8 = puVar3[local_6c];
          }
          iVar10 = local_6c % 3 + 1;
          if (iVar10 == 3) {
            iVar10 = 0;
          }
          uVar12 = iVar10 + (local_6c / 3) * 3;
          if (puVar3 != (uint32_t *)0x0) {
            uVar12 = puVar3[uVar12];
          }
          local_68 = uVar9;
          traverse(this,this->m_positions[uVar8],this->m_positions[uVar12]);
          if ((this->m_traversedCellOffsets).m_base.size == 0) {
            __assert_fail("!m_traversedCellOffsets.isEmpty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0x1022,"bool xatlas::internal::UniformGrid2::createGrid()");
          }
          if ((this->m_traversedCellOffsets).m_base.size != 0) {
            uVar7 = 0;
            do {
              uVar8 = *(uint *)((this->m_traversedCellOffsets).m_base.buffer + uVar7 * 4);
              if ((this->m_cellDataOffsets).m_base.size <= uVar8) goto LAB_001b43de;
              puVar4 = (this_00->m_base).buffer;
              iVar10 = *(int *)(puVar4 + (ulong)uVar8 * 4);
              if (iVar10 == -1) {
                *(uint32_t *)(puVar4 + (ulong)uVar8 * 4) = (this->m_cellData).m_base.size;
              }
              else {
                puVar4 = (this_01->m_base).buffer;
                do {
                  uVar8 = iVar10 + 1;
                  uVar12 = (this->m_cellData).m_base.size;
                  if (uVar12 <= uVar8) goto LAB_001b43de;
                  iVar10 = *(int *)(puVar4 + (ulong)uVar8 * 4);
                } while (iVar10 != -1);
                *(uint *)(puVar4 + (ulong)uVar8 * 4) = uVar12;
              }
              ArrayBase::push_back(&this_01->m_base,(uint8_t *)&local_6c);
              local_70[0] = 0xff;
              local_70[1] = 0xff;
              local_70[2] = 0xff;
              local_70[3] = 0xff;
              ArrayBase::push_back(&this_01->m_base,local_70);
              uVar8 = (int)uVar7 + 1;
              uVar7 = (ulong)uVar8;
            } while (uVar8 < (this->m_traversedCellOffsets).m_base.size);
          }
          uVar9 = local_68 + 1;
        } while (uVar9 != local_58);
        bVar5 = true;
      }
    }
  }
  return bVar5;
}

Assistant:

bool createGrid()
	{
		// Compute edge extents. Min will be the grid origin.
		const uint32_t edgeCount = m_edges.size();
		Extents2 edgeExtents;
		edgeExtents.reset();
		for (uint32_t i = 0; i < edgeCount; i++) {
			const uint32_t edge = m_edges[i];
			edgeExtents.add(edgePosition0(edge));
			edgeExtents.add(edgePosition1(edge));
		}
		m_gridOrigin = edgeExtents.min;
		// Size grid to approximately one edge per cell.
		const Vector2 extentsSize(edgeExtents.max - edgeExtents.min);
		m_cellSize = min(extentsSize.x, extentsSize.y) / sqrtf((float)edgeCount);
		if (m_cellSize <= 0.0f)
			return false;
		m_gridWidth = uint32_t(ceilf(extentsSize.x / m_cellSize));
		m_gridHeight = uint32_t(ceilf(extentsSize.y / m_cellSize));
		if (m_gridWidth == 0 || m_gridHeight == 0)
			return false;
		// Insert edges into cells.
		m_cellDataOffsets.resize(m_gridWidth * m_gridHeight);
		for (uint32_t i = 0; i < m_cellDataOffsets.size(); i++)
			m_cellDataOffsets[i] = UINT32_MAX;
		m_cellData.clear();
		m_cellData.reserve(edgeCount * 2);
		for (uint32_t i = 0; i < edgeCount; i++) {
			const uint32_t edge = m_edges[i];
			traverse(edgePosition0(edge), edgePosition1(edge));
			XA_DEBUG_ASSERT(!m_traversedCellOffsets.isEmpty());
			for (uint32_t j = 0; j < m_traversedCellOffsets.size(); j++) {
				const uint32_t cell = m_traversedCellOffsets[j];
				uint32_t offset = m_cellDataOffsets[cell];
				if (offset == UINT32_MAX)
					m_cellDataOffsets[cell] = m_cellData.size();
				else {
					for (;;) {
						uint32_t &nextOffset = m_cellData[offset + 1];
						if (nextOffset == UINT32_MAX) {
							nextOffset = m_cellData.size();
							break;
						}
						offset = nextOffset;
					}
				}
				m_cellData.push_back(edge);
				m_cellData.push_back(UINT32_MAX);
			}
		}
		return true;
	}